

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  int iVar28;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  char w_1;
  char val;
  int j_6;
  __m128i _sh;
  __m128i _sl;
  __m128i _w_1;
  __m128i _w0123_3;
  __m128i _val_3;
  __m128i _val0123;
  int j_7;
  __m128i _sum;
  int sum_2;
  int nn1_3;
  int nn4_3;
  char *kptr0_3;
  char *tmpptr_5;
  char w;
  char val1;
  char val0;
  int j_4;
  __m128i _sh01_1;
  __m128i _sl01_1;
  __m128i _w;
  __m128i _w0123_2;
  __m128i _val01_2;
  __m128i _extval;
  __m128i _val_2;
  int j_5;
  __m128i _sum1_1;
  __m128i _sum0_1;
  int sum1;
  int sum0;
  int nn1_2;
  int nn4_2;
  char *kptr0_2;
  char *tmpptr_4;
  int i_3;
  int *outptr0_1;
  int p_1;
  int sum_1 [4];
  __m128i _sh00_2;
  __m128i _sl00_2;
  __m128i _w0123_1;
  __m128i _val_1;
  int j_2;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00_1;
  __m128i _sl00_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw01_1;
  __m128i _w01_1;
  __m128i _val0_1;
  __m128i _val01_1;
  int j_3;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn1_1;
  int nn4_1;
  char *kptr0_1;
  char *tmpptr_3;
  int sum [8];
  __m128i _sh00;
  __m128i _sl00;
  __m128i _w0123;
  __m128i _val;
  int j;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw01;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _val01;
  int j_1;
  __m128i _sum11;
  __m128i _sum01;
  __m128i _sum10;
  __m128i _sum00;
  int nn1;
  int nn4;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr3;
  int *outptr2;
  int *outptr1;
  int *outptr0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int k_3;
  char *img0_3;
  int k_2;
  char *img3_1;
  char *img2_1;
  char *img1_1;
  char *img0_2;
  int q_1;
  char *tmpptr_1;
  int i_1;
  int k_1;
  char *img0_1;
  int k;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int q;
  char *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_23;
  Mat *m_21;
  Mat *m_20;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_14;
  Mat *m_13;
  Mat *m_12;
  Mat *m_6;
  Mat *m;
  Mat *m_24;
  Mat *m_22;
  Mat *m_19;
  Mat *m_17;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  __m128i sum32_2;
  __m128i hi32_2;
  __m128i sum64_2;
  __m128i hi64_2;
  __m128i sum32_1;
  __m128i hi32_1;
  __m128i sum64_1;
  __m128i hi64_1;
  __m128i sum32;
  __m128i hi32;
  __m128i sum64;
  __m128i hi64;
  int in_stack_ffffffffffffc774;
  size_t _elemsize;
  undefined1 in_stack_ffffffffffffc778 [16];
  int _h;
  undefined8 in_stack_ffffffffffffc788;
  int _w_00;
  Mat *in_stack_ffffffffffffc790;
  undefined8 local_3868;
  undefined8 uStack_3860;
  undefined8 local_3858;
  undefined8 uStack_3850;
  undefined8 local_3848;
  undefined8 uStack_3840;
  undefined8 local_3838;
  undefined8 uStack_3830;
  Allocator *local_3818;
  undefined8 local_35f8;
  undefined8 uStack_35f0;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined8 local_35c8;
  undefined8 uStack_35c0;
  undefined8 local_35b8;
  undefined8 uStack_35b0;
  undefined8 local_35a8;
  undefined8 uStack_35a0;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined8 local_3548;
  undefined8 uStack_3540;
  undefined8 local_3538;
  undefined8 uStack_3530;
  undefined8 local_3528;
  undefined8 uStack_3520;
  undefined8 local_3518;
  undefined8 uStack_3510;
  undefined8 local_3508;
  undefined8 uStack_3500;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  undefined8 uStack_34e0;
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  undefined8 local_34c8;
  undefined8 uStack_34c0;
  undefined8 local_32a8;
  ulong uStack_32a0;
  undefined8 local_3288;
  undefined8 uStack_3280;
  undefined8 local_3278;
  undefined8 uStack_3270;
  undefined8 local_3258;
  undefined8 uStack_3250;
  undefined8 local_3248;
  undefined8 uStack_3240;
  undefined8 local_3238;
  undefined8 uStack_3230;
  undefined8 local_31f8;
  ulong uStack_31f0;
  undefined8 local_31e8;
  undefined8 uStack_31e0;
  int local_2dac;
  int local_2d3c;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  int local_2d1c;
  undefined8 local_2d10;
  undefined8 local_2d08;
  undefined8 local_2d00;
  undefined4 local_2cf8;
  long local_2cf0;
  undefined4 local_2ce8;
  undefined4 local_2ce4;
  undefined4 local_2ce0;
  undefined4 local_2cdc;
  undefined4 local_2cd8;
  undefined8 local_2cd0;
  ulong *local_2cc8;
  undefined8 local_2cc0;
  undefined8 local_2cb8;
  undefined8 local_2cb0;
  undefined4 local_2ca8;
  long *local_2ca0;
  undefined4 local_2c98;
  undefined4 local_2c94;
  undefined4 local_2c90;
  undefined4 local_2c8c;
  undefined4 local_2c88;
  undefined8 local_2c80;
  ulong *local_2c78;
  char local_2c6f;
  char local_2c6e;
  char local_2c6d;
  int local_2c6c;
  undefined4 local_2bec;
  undefined8 local_2be8;
  ulong uStack_2be0;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  int local_2bc8;
  int local_2bc4;
  int local_2bc0;
  int local_2bbc;
  undefined8 local_2bb8;
  undefined8 local_2bb0;
  undefined8 local_2ba8;
  undefined4 local_2ba0;
  long local_2b98;
  undefined4 local_2b90;
  undefined4 local_2b8c;
  undefined4 local_2b88;
  undefined4 local_2b84;
  undefined4 local_2b80;
  undefined8 local_2b78;
  char *local_2b70;
  undefined8 local_2b68;
  undefined8 local_2b60;
  undefined8 local_2b58;
  undefined4 local_2b50;
  long *local_2b48;
  undefined4 local_2b40;
  undefined4 local_2b3c;
  undefined4 local_2b38;
  undefined4 local_2b34;
  undefined4 local_2b30;
  undefined8 local_2b28;
  char *local_2b20;
  int local_2b14;
  undefined8 local_2b10;
  undefined8 local_2b08;
  undefined8 local_2b00;
  undefined4 local_2af8;
  long local_2af0;
  undefined4 local_2ae8;
  undefined4 local_2ae4;
  undefined4 local_2ae0;
  undefined4 local_2adc;
  undefined4 local_2ad8;
  undefined8 local_2ad0;
  int *local_2ac8;
  int local_2abc;
  undefined4 local_2ab8;
  undefined4 uStack_2ab4;
  undefined4 uStack_2ab0;
  undefined4 uStack_2aac;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  int local_2a5c;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined4 local_296c;
  undefined8 local_2968;
  undefined8 uStack_2960;
  undefined8 local_2958;
  undefined8 uStack_2950;
  undefined8 local_2948;
  undefined8 uStack_2940;
  undefined8 local_2938;
  undefined8 uStack_2930;
  int local_2920;
  int local_291c;
  undefined8 local_2918;
  undefined8 local_2910;
  undefined8 local_2908;
  undefined4 local_2900;
  long local_28f8;
  undefined4 local_28f0;
  undefined4 local_28ec;
  undefined4 local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined8 local_28d8;
  ulong *local_28d0;
  undefined8 local_28c8;
  undefined8 local_28c0;
  undefined8 local_28b8;
  undefined4 local_28b0;
  long *local_28a8;
  undefined4 local_28a0;
  undefined4 local_289c;
  undefined4 local_2898;
  undefined4 local_2894;
  undefined4 local_2890;
  undefined8 local_2888;
  ulong *local_2880;
  undefined4 local_2878;
  undefined4 uStack_2874;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  undefined4 local_2868;
  undefined4 uStack_2864;
  undefined4 uStack_2860;
  undefined4 uStack_285c;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined1 local_2838 [16];
  undefined8 local_2828;
  undefined8 uStack_2820;
  int local_280c;
  undefined4 local_278c;
  undefined8 local_2788;
  ulong uStack_2780;
  undefined8 local_2778;
  ulong uStack_2770;
  undefined8 local_2768;
  ulong uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  int local_2740;
  int local_273c;
  undefined8 local_2738;
  undefined8 local_2730;
  undefined8 local_2728;
  undefined4 local_2720;
  long local_2718;
  undefined4 local_2710;
  undefined4 local_270c;
  undefined4 local_2708;
  undefined4 local_2704;
  undefined4 local_2700;
  undefined8 local_26f8;
  ulong *local_26f0;
  undefined8 local_26e8;
  undefined8 local_26e0;
  undefined8 local_26d8;
  undefined4 local_26d0;
  long *local_26c8;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  undefined4 local_26b4;
  undefined4 local_26b0;
  undefined8 local_26a8;
  ulong *local_26a0;
  int local_2694;
  undefined8 local_2690;
  undefined8 local_2688;
  undefined8 local_2680;
  undefined4 local_2678;
  long local_2670;
  undefined4 local_2668;
  undefined4 local_2664;
  undefined4 local_2660;
  undefined4 local_265c;
  undefined4 local_2658;
  undefined8 local_2650;
  undefined4 *local_2648;
  undefined8 local_2640;
  undefined8 local_2638;
  undefined8 local_2630;
  undefined4 local_2628;
  long local_2620;
  undefined4 local_2618;
  undefined4 local_2614;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined8 local_2600;
  undefined4 *local_25f8;
  undefined8 local_25f0;
  undefined8 local_25e8;
  undefined8 local_25e0;
  undefined4 local_25d8;
  long local_25d0;
  undefined4 local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  undefined8 local_25b0;
  undefined4 *local_25a8;
  undefined8 local_25a0;
  undefined8 local_2598;
  undefined8 local_2590;
  undefined4 local_2588;
  long local_2580;
  undefined4 local_2578;
  undefined4 local_2574;
  undefined4 local_2570;
  undefined4 local_256c;
  undefined4 local_2568;
  undefined8 local_2560;
  undefined4 *local_2558;
  int local_254c;
  int local_2548;
  int local_2544;
  int local_2540;
  int local_253c;
  undefined8 local_2538;
  undefined8 local_2530;
  undefined8 local_2528;
  undefined4 local_2520;
  long local_2518;
  undefined4 local_2510;
  undefined4 local_250c;
  undefined4 local_2508;
  undefined4 local_2504;
  undefined4 local_2500;
  undefined8 local_24f8;
  undefined1 *local_24f0;
  int local_24e4;
  undefined8 local_24e0;
  undefined8 local_24d8;
  undefined8 local_24d0;
  undefined4 local_24c8;
  long local_24c0;
  undefined4 local_24b8;
  undefined4 local_24b4;
  undefined4 local_24b0;
  undefined4 local_24ac;
  undefined4 local_24a8;
  undefined8 local_24a0;
  undefined1 *local_2498;
  undefined8 local_2490;
  undefined8 local_2488;
  undefined8 local_2480;
  undefined4 local_2478;
  long local_2470;
  undefined4 local_2468;
  undefined4 local_2464;
  undefined4 local_2460;
  undefined4 local_245c;
  undefined4 local_2458;
  undefined8 local_2450;
  undefined1 *local_2448;
  undefined8 local_2440;
  undefined8 local_2438;
  undefined8 local_2430;
  undefined4 local_2428;
  long local_2420;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined8 local_2400;
  undefined1 *local_23f8;
  undefined8 local_23f0;
  undefined8 local_23e8;
  undefined8 local_23e0;
  undefined4 local_23d8;
  long local_23d0;
  undefined4 local_23c8;
  undefined4 local_23c4;
  undefined4 local_23c0;
  undefined4 local_23bc;
  undefined4 local_23b8;
  undefined8 local_23b0;
  undefined1 *local_23a8;
  int local_239c;
  undefined8 local_2398;
  undefined8 local_2390;
  undefined8 local_2388;
  undefined4 local_2380;
  long *local_2378;
  undefined4 local_2370;
  undefined4 local_236c;
  undefined4 local_2368;
  undefined4 local_2364;
  undefined4 local_2360;
  undefined8 local_2358;
  undefined1 *local_2350;
  int local_2348;
  int local_2344;
  undefined8 local_2340;
  undefined8 local_2338;
  undefined8 local_2330;
  undefined4 local_2328;
  long local_2320;
  undefined4 local_2318;
  undefined4 local_2314;
  undefined4 local_2310;
  undefined4 local_230c;
  undefined4 local_2308;
  undefined8 local_2300;
  undefined1 *local_22f8;
  int local_22ec;
  undefined8 local_22e8;
  undefined8 local_22e0;
  undefined8 local_22d8;
  undefined4 local_22d0;
  long local_22c8;
  undefined4 local_22c0;
  undefined4 local_22bc;
  undefined4 local_22b8;
  undefined4 local_22b4;
  undefined4 local_22b0;
  undefined8 local_22a8;
  undefined1 *local_22a0;
  undefined8 local_2298;
  undefined8 local_2290;
  undefined8 local_2288;
  undefined4 local_2280;
  long local_2278;
  undefined4 local_2270;
  undefined4 local_226c;
  undefined4 local_2268;
  undefined4 local_2264;
  undefined4 local_2260;
  undefined8 local_2258;
  undefined1 *local_2250;
  undefined8 local_2248;
  undefined8 local_2240;
  undefined8 local_2238;
  undefined4 local_2230;
  long local_2228;
  undefined4 local_2220;
  undefined4 local_221c;
  undefined4 local_2218;
  undefined4 local_2214;
  undefined4 local_2210;
  undefined8 local_2208;
  undefined1 *local_2200;
  undefined8 local_21f8;
  undefined8 local_21f0;
  undefined8 local_21e8;
  undefined4 local_21e0;
  long local_21d8;
  undefined4 local_21d0;
  undefined4 local_21cc;
  undefined4 local_21c8;
  undefined4 local_21c4;
  undefined4 local_21c0;
  undefined8 local_21b8;
  undefined1 *local_21b0;
  int local_21a4;
  undefined8 local_21a0;
  undefined8 local_2198;
  undefined8 local_2190;
  undefined4 local_2188;
  long *local_2180;
  undefined4 local_2178;
  undefined4 local_2174;
  undefined4 local_2170;
  undefined4 local_216c;
  undefined4 local_2168;
  undefined8 local_2160;
  undefined1 *local_2158;
  int local_214c;
  int local_2148;
  int local_2144;
  int local_2140;
  void *local_2130;
  int *local_2128;
  long local_2120;
  undefined4 local_2118;
  long *local_2110;
  undefined4 local_2108;
  int local_2104;
  int local_2100;
  undefined4 local_20fc;
  undefined4 local_20f8;
  long local_20f0;
  int local_20e8;
  int local_20e4;
  int local_20e0;
  int local_20dc;
  long *local_20d0;
  long *local_20c8;
  long *local_20c0;
  void **local_20b8;
  undefined1 local_20ad;
  int local_20ac;
  void **local_20a8;
  undefined8 *local_20a0;
  undefined1 local_2095;
  int local_2094;
  void **local_2090;
  undefined8 *local_2088;
  undefined1 local_207d;
  int local_207c;
  undefined8 *local_2070;
  undefined1 local_2065;
  int local_2064;
  void **local_2060;
  undefined8 *local_2058;
  undefined1 local_204d;
  int local_204c;
  void **local_2048;
  undefined8 *local_2040;
  undefined1 local_2035;
  int local_2034;
  undefined8 *local_2028;
  undefined1 local_201d;
  int local_201c;
  undefined8 *local_2010;
  undefined1 local_2005;
  int local_2004;
  undefined8 *local_1ff8;
  undefined1 local_1fed;
  int local_1fec;
  undefined8 *local_1fe0;
  undefined1 local_1fd5;
  int local_1fd4;
  void **local_1fd0;
  undefined8 *local_1fc8;
  undefined1 local_1fbd;
  int local_1fbc;
  void **local_1fb8;
  undefined8 *local_1fb0;
  undefined8 *local_1fa8;
  undefined8 *local_1fa0;
  undefined8 *local_1f40;
  undefined8 *local_1f30;
  undefined8 *local_1f20;
  undefined8 *local_1f10;
  undefined8 *local_1f00;
  undefined8 *local_1ef0;
  undefined8 *local_1ee0;
  undefined8 *local_1ed0;
  undefined8 *local_1ec0;
  undefined8 *local_1eb0;
  undefined8 *local_1ea0;
  undefined8 *local_1e90;
  undefined8 *local_1e80;
  undefined8 *local_1e70;
  undefined8 *local_1e60;
  undefined8 *local_1e50;
  undefined8 *local_1e40;
  undefined8 *local_1e30;
  undefined8 *local_1e20;
  undefined8 *local_1e10;
  undefined8 *local_1e00;
  undefined8 *local_1df0;
  undefined8 *local_1de0;
  undefined8 *local_1dd0;
  undefined8 *local_1dc0;
  void **local_1db0;
  undefined1 local_1d9d;
  int local_1d9c;
  undefined8 *local_1d90;
  undefined1 local_1d7d;
  int local_1d7c;
  undefined8 *local_1d70;
  undefined1 local_1d5d;
  int local_1d5c;
  undefined8 *local_1d50;
  undefined1 local_1d3d;
  int local_1d3c;
  undefined8 *local_1d30;
  undefined1 local_1d1d;
  int local_1d1c;
  undefined8 *local_1d10;
  undefined1 local_1cfd;
  int local_1cfc;
  undefined8 *local_1cf0;
  undefined1 local_1cdd;
  int local_1cdc;
  undefined8 *local_1cd0;
  undefined1 local_1cbd;
  int local_1cbc;
  undefined8 *local_1cb0;
  undefined1 local_1c9d;
  int local_1c9c;
  undefined8 *local_1c90;
  undefined1 local_1c7d;
  int local_1c7c;
  undefined8 *local_1c70;
  undefined1 local_1c5d;
  int local_1c5c;
  undefined8 *local_1c50;
  undefined1 local_1c3d;
  int local_1c3c;
  undefined8 *local_1c30;
  undefined1 local_1c1d;
  int local_1c1c;
  undefined8 *local_1c10;
  undefined1 local_1bfd;
  int local_1bfc;
  undefined8 *local_1bf0;
  undefined8 *local_1be0;
  undefined8 *local_1bd8;
  undefined8 *local_1bd0;
  undefined8 *local_1bc8;
  undefined8 *local_1bc0;
  undefined8 *local_1bb8;
  undefined8 *local_1bb0;
  undefined8 *local_1ba8;
  undefined8 *local_1ba0;
  undefined8 *local_1b98;
  undefined8 *local_1b90;
  undefined8 *local_1b88;
  undefined8 *local_1b80;
  undefined8 *local_1b78;
  undefined8 *local_1b70;
  undefined8 *local_1b68;
  undefined8 *local_1b60;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined8 *local_1b38;
  undefined8 *local_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 local_1b08 [16];
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined1 local_1a88 [16];
  undefined1 local_1a78 [16];
  undefined1 local_1a68 [16];
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  ulong local_1a48;
  undefined8 uStack_1a40;
  ulong *local_1a30;
  ulong local_1a28;
  undefined8 uStack_1a20;
  ulong *local_1a10;
  ulong local_19c8;
  undefined8 uStack_19c0;
  ulong *local_19b0;
  ulong local_1988;
  undefined8 uStack_1980;
  ulong *local_1970;
  ulong local_1948;
  undefined8 uStack_1940;
  ulong local_1938;
  undefined8 uStack_1930;
  ulong local_1918;
  undefined8 uStack_1910;
  ulong local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_1708;
  ulong uStack_1700;
  undefined8 local_16f8;
  ulong uStack_16f0;
  undefined8 local_16e8;
  ulong uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined1 local_16c8 [16];
  ushort local_16b8;
  ushort local_16b6;
  ushort local_16b4;
  ushort local_16b2;
  ushort local_16b0;
  ushort local_16ae;
  ushort local_16ac;
  ushort local_16aa;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  ulong uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined4 *local_1230;
  undefined8 local_1228;
  ulong uStack_1220;
  undefined4 *local_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined4 *local_11f0;
  undefined8 local_11e8;
  ulong uStack_11e0;
  undefined8 local_11d8;
  ulong uStack_11d0;
  undefined8 local_11c8;
  ulong uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  ulong uStack_11a0;
  undefined8 local_1198;
  ulong uStack_1190;
  undefined8 local_1188;
  ulong uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  ushort local_10da;
  undefined1 local_10d8 [16];
  ushort local_10c8;
  ushort local_10c6;
  ushort local_10c4;
  ushort local_10c2;
  ushort local_10c0;
  ushort local_10be;
  ushort local_10bc;
  ushort local_10ba;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  ulong uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  ulong uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  ulong uStack_f70;
  undefined8 local_f68;
  ulong uStack_f60;
  undefined1 local_f58 [16];
  undefined1 local_f48 [16];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  long local_ea8;
  undefined4 local_e9c;
  long local_e98;
  long local_e90;
  undefined4 local_e84;
  int local_e80;
  int local_e7c;
  undefined8 *local_e78;
  long local_e70;
  undefined4 local_e64;
  long local_e60;
  long local_e58;
  undefined4 local_e4c;
  int local_e48;
  int local_e44;
  undefined8 *local_e40;
  long local_e38;
  undefined4 local_e2c;
  long local_e28;
  long local_e20;
  undefined4 local_e14;
  int local_e10;
  int local_e0c;
  undefined8 *local_e08;
  long local_e00;
  undefined4 local_df4;
  long local_df0;
  long local_de8;
  undefined4 local_ddc;
  int local_dd8;
  int local_dd4;
  undefined8 *local_dd0;
  long local_dc8;
  undefined4 local_dbc;
  long local_db8;
  long local_db0;
  undefined4 local_da4;
  int local_da0;
  int local_d9c;
  undefined8 *local_d98;
  long local_d90;
  undefined4 local_d84;
  long local_d80;
  long local_d78;
  undefined4 local_d6c;
  int local_d68;
  int local_d64;
  undefined8 *local_d60;
  long local_d58;
  undefined4 local_d4c;
  long local_d48;
  long local_d40;
  undefined4 local_d34;
  int local_d30;
  int local_d2c;
  undefined8 *local_d28;
  long local_d20;
  undefined4 local_d14;
  long local_d10;
  long local_d08;
  undefined4 local_cfc;
  int local_cf8;
  int local_cf4;
  undefined8 *local_cf0;
  long local_ce8;
  undefined4 local_cdc;
  long local_cd8;
  long local_cd0;
  undefined4 local_cc4;
  int local_cc0;
  int local_cbc;
  undefined8 *local_cb8;
  long local_cb0;
  undefined4 local_ca4;
  long local_ca0;
  long local_c98;
  undefined4 local_c8c;
  int local_c88;
  int local_c84;
  undefined8 *local_c80;
  long local_c78;
  undefined4 local_c6c;
  long local_c68;
  ulong *local_c60;
  undefined4 local_c54;
  int local_c50;
  int local_c4c;
  undefined8 *local_c48;
  long local_c40;
  undefined4 local_c34;
  long local_c30;
  ulong *local_c28;
  undefined4 local_c1c;
  int local_c18;
  int local_c14;
  undefined8 *local_c10;
  long local_c08;
  undefined4 local_bfc;
  long local_bf8;
  char *local_bf0;
  undefined4 local_be4;
  int local_be0;
  int local_bdc;
  undefined8 *local_bd8;
  long local_bd0;
  undefined4 local_bc4;
  long local_bc0;
  ulong *local_bb8;
  undefined4 local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 *local_ba0;
  long *local_b98;
  undefined4 local_b8c;
  long local_b88;
  undefined1 *local_b80;
  undefined4 local_b74;
  int local_b70;
  int local_b6c;
  undefined8 *local_b68;
  long *local_b60;
  undefined4 local_b54;
  long local_b50;
  undefined1 *local_b48;
  undefined4 local_b3c;
  int local_b38;
  int local_b34;
  undefined8 *local_b30;
  long local_b28;
  undefined4 local_b1c;
  long local_b18;
  undefined4 *local_b10;
  undefined4 local_b04;
  int local_b00;
  int local_afc;
  undefined8 *local_af8;
  long local_af0;
  undefined4 local_ae4;
  long local_ae0;
  undefined4 *local_ad8;
  undefined4 local_acc;
  int local_ac8;
  int local_ac4;
  undefined8 *local_ac0;
  long local_ab8;
  undefined4 local_aac;
  long local_aa8;
  undefined4 *local_aa0;
  undefined4 local_a94;
  int local_a90;
  int local_a8c;
  undefined8 *local_a88;
  long local_a80;
  undefined4 local_a74;
  long local_a70;
  undefined4 *local_a68;
  undefined4 local_a5c;
  int local_a58;
  int local_a54;
  undefined8 *local_a50;
  long *local_a48;
  undefined4 local_a3c;
  long local_a38;
  ulong *local_a30;
  undefined4 local_a24;
  int local_a20;
  int local_a1c;
  undefined8 *local_a18;
  long *local_a10;
  undefined4 local_a04;
  long local_a00;
  ulong *local_9f8;
  undefined4 local_9ec;
  int local_9e8;
  int local_9e4;
  undefined8 *local_9e0;
  long local_9d8;
  undefined4 local_9cc;
  long local_9c8;
  int *local_9c0;
  undefined4 local_9b4;
  int local_9b0;
  int local_9ac;
  undefined8 *local_9a8;
  long *local_9a0;
  undefined4 local_994;
  long local_990;
  char *local_988;
  undefined4 local_97c;
  int local_978;
  int local_974;
  undefined8 *local_970;
  long *local_968;
  undefined4 local_95c;
  long local_958;
  ulong *local_950;
  undefined4 local_944;
  int local_940;
  int local_93c;
  undefined8 *local_938;
  undefined4 local_92c;
  long local_928;
  undefined4 local_91c;
  long local_918;
  undefined4 local_90c;
  long local_908;
  undefined4 local_8fc;
  long local_8f8;
  undefined4 local_8ec;
  long local_8e8;
  undefined4 local_8dc;
  long local_8d8;
  undefined4 local_8cc;
  long local_8c8;
  undefined4 local_8bc;
  long local_8b8;
  undefined4 local_8ac;
  long local_8a8;
  undefined4 local_89c;
  long local_898;
  undefined4 local_88c;
  long local_888;
  undefined4 local_87c;
  long local_878;
  undefined4 local_86c;
  long local_868;
  undefined4 local_85c;
  long local_858;
  undefined4 local_84c;
  long local_848;
  undefined4 local_83c;
  long local_838;
  undefined4 local_82c;
  long local_828;
  undefined4 local_81c;
  long local_818;
  undefined4 local_80c;
  long local_808;
  undefined4 local_7fc;
  long local_7f8;
  undefined4 local_7ec;
  long local_7e8;
  undefined4 local_7dc;
  long local_7d8;
  undefined4 local_7cc;
  long local_7c8;
  undefined4 local_7bc;
  long local_7b8;
  undefined4 local_7ac;
  long local_7a8;
  int local_6b0;
  undefined4 local_6ac;
  void **local_6a8;
  undefined8 *local_688;
  undefined8 *local_668;
  undefined8 *local_648;
  undefined8 *local_628;
  undefined8 *local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined8 *local_5a8;
  undefined8 *local_588;
  undefined8 *local_568;
  undefined8 *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  undefined8 *local_3c8;
  undefined8 *local_3a8;
  undefined8 *local_388;
  void *local_e8;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_20dc = *(int *)((long)in_RDI + 0x2c);
  local_20e0 = (int)in_RDI[6];
  local_20e4 = (int)in_RDI[7];
  local_20e8 = (int)in_RSI[7];
  local_20b8 = &local_2130;
  local_2130 = (void *)0x0;
  local_2128 = (int *)0x0;
  local_2120 = 0;
  local_2118 = 0;
  local_2110 = (long *)0x0;
  local_2108 = 0;
  local_2104 = 0;
  local_2100 = 0;
  local_20fc = 0;
  local_20f8 = 0;
  local_20f0 = 0;
  iVar28 = in_stack_ffffffffffffc778._12_4_;
  _elemsize = in_stack_ffffffffffffc778._0_8_;
  _h = (int)in_stack_ffffffffffffc788;
  _w_00 = (int)((ulong)in_stack_ffffffffffffc788 >> 0x20);
  local_20d0 = in_RDX;
  local_20c8 = in_RSI;
  local_20c0 = in_RDI;
  if (local_20e4 < 4) {
    if (local_20dc < 2) {
      Mat::create(in_stack_ffffffffffffc790,_w_00,_h,iVar28,_elemsize,in_stack_ffffffffffffc774,
                  local_3818);
    }
    else {
      Mat::create(in_stack_ffffffffffffc790,_w_00,_h,iVar28,_elemsize,in_stack_ffffffffffffc774,
                  local_3818);
    }
  }
  else if (local_20dc < 2) {
    Mat::create(in_stack_ffffffffffffc790,_w_00,_h,iVar28,_elemsize,in_stack_ffffffffffffc774,
                local_3818);
  }
  else {
    Mat::create(in_stack_ffffffffffffc790,_w_00,_h,iVar28,_elemsize,in_stack_ffffffffffffc774,
                local_3818);
  }
  local_2144 = local_20dc >> 1;
  for (local_2148 = 0; local_2148 < local_2144; local_2148 = local_2148 + 1) {
    local_214c = local_2148 * 2;
    local_1fbc = local_214c / 2;
    local_1fb0 = &local_21a0;
    local_1fb8 = &local_2130;
    local_b80 = (undefined1 *)((long)local_2130 + local_20f0 * local_1fbc * local_2120);
    local_b68 = &local_21a0;
    local_888 = (long)local_2104 * (long)local_2100 * local_2120;
    local_1fa0 = &local_21a0;
    local_1f40 = &local_21a0;
    local_2180 = local_2110;
    local_88c = 0x10;
    local_b6c = local_2104;
    local_b70 = local_2100;
    local_b74 = local_20fc;
    local_b88 = local_2120;
    local_b8c = local_2118;
    local_b98 = local_2110;
    local_1fbd = 1;
    local_21a0 = 0;
    local_2190 = 0;
    local_2188 = 0;
    local_2178 = 0;
    local_2174 = 0;
    local_2170 = 0;
    local_216c = 0;
    local_2168 = 0;
    local_2160 = 0;
    local_2198 = 0;
    local_2158 = local_b80;
    for (local_21a4 = 0; local_21a4 + 3 < local_20e4; local_21a4 = local_21a4 + 4) {
      local_1bf0 = &local_21f8;
      local_e7c = *(int *)((long)local_20c0 + 0x2c);
      local_e80 = (int)local_20c0[6];
      local_e84 = *(undefined4 *)((long)local_20c0 + 0x34);
      local_e90 = *local_20c0 + local_20c0[8] * (long)local_21a4 * local_20c0[2];
      local_e98 = local_20c0[2];
      local_e9c = (undefined4)local_20c0[3];
      local_ea8 = local_20c0[4];
      local_e78 = &local_21f8;
      local_7a8 = (long)local_e7c * (long)local_e80 * local_e98;
      local_1b78 = &local_21f8;
      local_21b0 = (undefined1 *)(local_e90 + local_214c);
      local_1f30 = &local_21f8;
      local_1c1c = local_21a4 + 1;
      local_1c10 = &local_2248;
      local_e44 = *(int *)((long)local_20c0 + 0x2c);
      local_e48 = (int)local_20c0[6];
      local_e4c = *(undefined4 *)((long)local_20c0 + 0x34);
      local_e58 = *local_20c0 + local_20c0[8] * (long)local_1c1c * local_20c0[2];
      local_e60 = local_20c0[2];
      local_e64 = (undefined4)local_20c0[3];
      local_e70 = local_20c0[4];
      local_e40 = &local_2248;
      local_7b8 = (long)local_e44 * (long)local_e48 * local_e60;
      local_1b80 = &local_2248;
      local_2200 = (undefined1 *)(local_e58 + local_214c);
      local_1f20 = &local_2248;
      local_1c3c = local_21a4 + 2;
      local_1c30 = &local_2298;
      local_e0c = *(int *)((long)local_20c0 + 0x2c);
      local_e10 = (int)local_20c0[6];
      local_e14 = *(undefined4 *)((long)local_20c0 + 0x34);
      local_e20 = *local_20c0 + local_20c0[8] * (long)local_1c3c * local_20c0[2];
      local_e28 = local_20c0[2];
      local_e2c = (undefined4)local_20c0[3];
      local_e38 = local_20c0[4];
      local_e08 = &local_2298;
      local_7c8 = (long)local_e0c * (long)local_e10 * local_e28;
      local_1b88 = &local_2298;
      local_2250 = (undefined1 *)(local_e20 + local_214c);
      local_1f10 = &local_2298;
      local_1c5c = local_21a4 + 3;
      local_1c50 = &local_22e8;
      local_dd4 = *(int *)((long)local_20c0 + 0x2c);
      local_dd8 = (int)local_20c0[6];
      local_ddc = *(undefined4 *)((long)local_20c0 + 0x34);
      local_de8 = *local_20c0 + local_20c0[8] * (long)local_1c5c * local_20c0[2];
      local_df0 = local_20c0[2];
      local_df4 = (undefined4)local_20c0[3];
      local_e00 = local_20c0[4];
      local_dd0 = &local_22e8;
      local_7d8 = (long)local_dd4 * (long)local_dd8 * local_df0;
      local_1b90 = &local_22e8;
      local_22a0 = (undefined1 *)(local_de8 + local_214c);
      local_1f00 = &local_22e8;
      local_21c0 = 0;
      local_21c4 = 0;
      local_21c8 = 0;
      local_21cc = 0;
      local_21e0 = 0;
      local_21e8 = 0;
      local_21f0 = 0;
      local_21f8 = 0;
      local_2210 = 0;
      local_2214 = 0;
      local_2218 = 0;
      local_221c = 0;
      local_2230 = 0;
      local_2238 = 0;
      local_2240 = 0;
      local_2248 = 0;
      local_2260 = 0;
      local_2264 = 0;
      local_2268 = 0;
      local_226c = 0;
      local_2280 = 0;
      local_2288 = 0;
      local_2290 = 0;
      local_2298 = 0;
      local_7ac = 0x10;
      local_7bc = 0x10;
      local_7cc = 0x10;
      local_7dc = 0x10;
      local_1bfc = local_21a4;
      local_1bfd = 1;
      local_1c1d = 1;
      local_1c3d = 1;
      local_1c5d = 1;
      local_21b8 = 0;
      local_21d0 = 0;
      local_2208 = 0;
      local_2220 = 0;
      local_2258 = 0;
      local_2270 = 0;
      local_22e8 = 0;
      local_22d8 = 0;
      local_22d0 = 0;
      local_22c0 = 0;
      local_22bc = 0;
      local_22b8 = 0;
      local_22b4 = 0;
      local_22b0 = 0;
      local_22a8 = 0;
      local_22e0 = 0;
      for (local_22ec = 0; local_22ec < local_20e0; local_22ec = local_22ec + 1) {
        *local_2158 = *local_21b0;
        local_2158[1] = *local_2200;
        local_2158[2] = *local_2250;
        local_2158[3] = *local_22a0;
        local_2158[4] = local_21b0[1];
        local_2158[5] = local_2200[1];
        local_2158[6] = local_2250[1];
        local_2158[7] = local_22a0[1];
        local_2158 = local_2158 + 8;
        local_21b0 = local_21b0 + local_20dc;
        local_2200 = local_2200 + local_20dc;
        local_2250 = local_2250 + local_20dc;
        local_22a0 = local_22a0 + local_20dc;
      }
      local_408 = local_1f00;
      local_3e8 = local_1f10;
      local_3c8 = local_1f20;
      local_3a8 = local_1f30;
      local_22c8 = local_e00;
      local_2278 = local_e38;
      local_2228 = local_e70;
      local_21d8 = local_ea8;
    }
    for (; local_21a4 < local_20e4; local_21a4 = local_21a4 + 1) {
      local_1c70 = &local_2340;
      local_d9c = *(int *)((long)local_20c0 + 0x2c);
      local_da0 = (int)local_20c0[6];
      local_da4 = *(undefined4 *)((long)local_20c0 + 0x34);
      local_db0 = *local_20c0 + local_20c0[8] * (long)local_21a4 * local_20c0[2];
      local_db8 = local_20c0[2];
      local_dbc = (undefined4)local_20c0[3];
      local_dc8 = local_20c0[4];
      local_d98 = &local_2340;
      local_7e8 = (long)local_d9c * (long)local_da0 * local_db8;
      local_7ec = 0x10;
      local_1c7c = local_21a4;
      local_1c7d = 1;
      local_1b98 = &local_2340;
      local_22f8 = (undefined1 *)(local_db0 + local_214c);
      local_1ef0 = &local_2340;
      local_2340 = 0;
      local_2330 = 0;
      local_2328 = 0;
      local_2318 = 0;
      local_2314 = 0;
      local_2310 = 0;
      local_230c = 0;
      local_2308 = 0;
      local_2300 = 0;
      local_2338 = 0;
      for (local_2344 = 0; local_2344 < local_20e0; local_2344 = local_2344 + 1) {
        *local_2158 = *local_22f8;
        local_2158[1] = local_22f8[1];
        local_2158 = local_2158 + 2;
        local_22f8 = local_22f8 + local_20dc;
      }
      local_428 = local_1ef0;
      local_2320 = local_dc8;
    }
    local_388 = local_1f40;
  }
  local_2140 = local_2144 * 2;
  for (local_2348 = local_2140; local_2348 < local_20dc; local_2348 = local_2348 + 1) {
    local_1fd4 = local_2348 / 2 + local_2348 % 2;
    local_1fc8 = &local_2398;
    local_1fd0 = &local_2130;
    local_b48 = (undefined1 *)((long)local_2130 + local_20f0 * local_1fd4 * local_2120);
    local_b30 = &local_2398;
    local_898 = (long)local_2104 * (long)local_2100 * local_2120;
    local_1fa8 = &local_2398;
    local_1ee0 = &local_2398;
    local_2378 = local_2110;
    local_89c = 0x10;
    local_b34 = local_2104;
    local_b38 = local_2100;
    local_b3c = local_20fc;
    local_b50 = local_2120;
    local_b54 = local_2118;
    local_b60 = local_2110;
    local_1fd5 = 1;
    local_2398 = 0;
    local_2388 = 0;
    local_2380 = 0;
    local_2370 = 0;
    local_236c = 0;
    local_2368 = 0;
    local_2364 = 0;
    local_2360 = 0;
    local_2358 = 0;
    local_2390 = 0;
    local_2350 = local_b48;
    for (local_239c = 0; local_239c + 3 < local_20e4; local_239c = local_239c + 4) {
      local_1c90 = &local_23f0;
      local_d64 = *(int *)((long)local_20c0 + 0x2c);
      local_d68 = (int)local_20c0[6];
      local_d6c = *(undefined4 *)((long)local_20c0 + 0x34);
      local_d78 = *local_20c0 + local_20c0[8] * (long)local_239c * local_20c0[2];
      local_d80 = local_20c0[2];
      local_d84 = (undefined4)local_20c0[3];
      local_d90 = local_20c0[4];
      local_d60 = &local_23f0;
      local_7f8 = (long)local_d64 * (long)local_d68 * local_d80;
      local_1ba0 = &local_23f0;
      local_23a8 = (undefined1 *)(local_d78 + local_2348);
      local_1ed0 = &local_23f0;
      local_1cbc = local_239c + 1;
      local_1cb0 = &local_2440;
      local_d2c = *(int *)((long)local_20c0 + 0x2c);
      local_d30 = (int)local_20c0[6];
      local_d34 = *(undefined4 *)((long)local_20c0 + 0x34);
      local_d40 = *local_20c0 + local_20c0[8] * (long)local_1cbc * local_20c0[2];
      local_d48 = local_20c0[2];
      local_d4c = (undefined4)local_20c0[3];
      local_d58 = local_20c0[4];
      local_d28 = &local_2440;
      local_808 = (long)local_d2c * (long)local_d30 * local_d48;
      local_1ba8 = &local_2440;
      local_23f8 = (undefined1 *)(local_d40 + local_2348);
      local_1ec0 = &local_2440;
      local_1cdc = local_239c + 2;
      local_1cd0 = &local_2490;
      local_cf4 = *(int *)((long)local_20c0 + 0x2c);
      local_cf8 = (int)local_20c0[6];
      local_cfc = *(undefined4 *)((long)local_20c0 + 0x34);
      local_d08 = *local_20c0 + local_20c0[8] * (long)local_1cdc * local_20c0[2];
      local_d10 = local_20c0[2];
      local_d14 = (undefined4)local_20c0[3];
      local_d20 = local_20c0[4];
      local_cf0 = &local_2490;
      local_818 = (long)local_cf4 * (long)local_cf8 * local_d10;
      local_1bb0 = &local_2490;
      local_2448 = (undefined1 *)(local_d08 + local_2348);
      local_1eb0 = &local_2490;
      local_1cfc = local_239c + 3;
      local_1cf0 = &local_24e0;
      local_cbc = *(int *)((long)local_20c0 + 0x2c);
      local_cc0 = (int)local_20c0[6];
      local_cc4 = *(undefined4 *)((long)local_20c0 + 0x34);
      local_cd0 = *local_20c0 + local_20c0[8] * (long)local_1cfc * local_20c0[2];
      local_cd8 = local_20c0[2];
      local_cdc = (undefined4)local_20c0[3];
      local_ce8 = local_20c0[4];
      local_cb8 = &local_24e0;
      local_828 = (long)local_cbc * (long)local_cc0 * local_cd8;
      local_1bb8 = &local_24e0;
      local_2498 = (undefined1 *)(local_cd0 + local_2348);
      local_1ea0 = &local_24e0;
      local_23b8 = 0;
      local_23bc = 0;
      local_23c0 = 0;
      local_23c4 = 0;
      local_23d8 = 0;
      local_23e0 = 0;
      local_23e8 = 0;
      local_23f0 = 0;
      local_2408 = 0;
      local_240c = 0;
      local_2410 = 0;
      local_2414 = 0;
      local_2428 = 0;
      local_2430 = 0;
      local_2438 = 0;
      local_2440 = 0;
      local_2458 = 0;
      local_245c = 0;
      local_2460 = 0;
      local_2464 = 0;
      local_2478 = 0;
      local_2480 = 0;
      local_2488 = 0;
      local_2490 = 0;
      local_7fc = 0x10;
      local_80c = 0x10;
      local_81c = 0x10;
      local_82c = 0x10;
      local_1c9c = local_239c;
      local_1c9d = 1;
      local_1cbd = 1;
      local_1cdd = 1;
      local_1cfd = 1;
      local_23b0 = 0;
      local_23c8 = 0;
      local_2400 = 0;
      local_2418 = 0;
      local_2450 = 0;
      local_2468 = 0;
      local_24e0 = 0;
      local_24d0 = 0;
      local_24c8 = 0;
      local_24b8 = 0;
      local_24b4 = 0;
      local_24b0 = 0;
      local_24ac = 0;
      local_24a8 = 0;
      local_24a0 = 0;
      local_24d8 = 0;
      for (local_24e4 = 0; local_24e4 < local_20e0; local_24e4 = local_24e4 + 1) {
        *local_2350 = *local_23a8;
        local_2350[1] = *local_23f8;
        local_2350[2] = *local_2448;
        local_2350[3] = *local_2498;
        local_2350 = local_2350 + 4;
        local_23a8 = local_23a8 + local_20dc;
        local_23f8 = local_23f8 + local_20dc;
        local_2448 = local_2448 + local_20dc;
        local_2498 = local_2498 + local_20dc;
      }
      local_4c8 = local_1ea0;
      local_4a8 = local_1eb0;
      local_488 = local_1ec0;
      local_468 = local_1ed0;
      local_24c0 = local_ce8;
      local_2470 = local_d20;
      local_2420 = local_d58;
      local_23d0 = local_d90;
    }
    for (; local_239c < local_20e4; local_239c = local_239c + 1) {
      local_1d10 = &local_2538;
      local_c84 = *(int *)((long)local_20c0 + 0x2c);
      local_c88 = (int)local_20c0[6];
      local_c8c = *(undefined4 *)((long)local_20c0 + 0x34);
      local_c98 = *local_20c0 + local_20c0[8] * (long)local_239c * local_20c0[2];
      local_ca0 = local_20c0[2];
      local_ca4 = (undefined4)local_20c0[3];
      local_cb0 = local_20c0[4];
      local_c80 = &local_2538;
      local_838 = (long)local_c84 * (long)local_c88 * local_ca0;
      local_83c = 0x10;
      local_1d1c = local_239c;
      local_1d1d = 1;
      local_1bc0 = &local_2538;
      local_24f0 = (undefined1 *)(local_c98 + local_2348);
      local_1e90 = &local_2538;
      local_2538 = 0;
      local_2528 = 0;
      local_2520 = 0;
      local_2510 = 0;
      local_250c = 0;
      local_2508 = 0;
      local_2504 = 0;
      local_2500 = 0;
      local_24f8 = 0;
      local_2530 = 0;
      for (local_253c = 0; local_253c < local_20e0; local_253c = local_253c + 1) {
        *local_2350 = *local_24f0;
        local_2350 = local_2350 + 1;
        local_24f0 = local_24f0 + local_20dc;
      }
      local_4e8 = local_1e90;
      local_2518 = local_cb0;
    }
    local_448 = local_1ee0;
  }
  local_2540 = local_20e8 >> 2;
  local_2548 = 0;
  do {
    if (local_2540 <= local_2548) {
      local_2544 = local_2540 * 4;
      local_2abc = local_2544;
      do {
        if (local_20e8 <= local_2abc) {
          local_1db0 = &local_2130;
          if (local_2128 != (int *)0x0) {
            local_6ac = 0xffffffff;
            LOCK();
            local_6b0 = *local_2128;
            *local_2128 = *local_2128 + -1;
            UNLOCK();
            if (local_6b0 == 1) {
              local_6a8 = local_1db0;
              if (local_2110 == (long *)0x0) {
                local_e8 = local_2130;
                if (local_2130 != (void *)0x0) {
                  free(local_2130);
                }
              }
              else {
                (**(code **)(*local_2110 + 0x18))(local_2110,local_2130);
              }
            }
          }
          return;
        }
        local_2070 = &local_2b10;
        local_9ac = *(int *)((long)local_20c8 + 0x2c);
        local_9b0 = (int)local_20c8[6];
        local_9b4 = *(undefined4 *)((long)local_20c8 + 0x34);
        local_9c0 = (int *)(*local_20c8 + local_20c8[8] * (long)local_2abc * local_20c8[2]);
        local_9c8 = local_20c8[2];
        local_9cc = (undefined4)local_20c8[3];
        local_9d8 = local_20c8[4];
        local_9a8 = &local_2b10;
        local_908 = (long)local_9ac * (long)local_9b0 * local_9c8;
        local_1b70 = &local_2b10;
        local_1e00 = &local_2b10;
        local_90c = 0x10;
        local_207c = local_2abc;
        local_207d = 1;
        local_2b10 = 0;
        local_2b00 = 0;
        local_2af8 = 0;
        local_2ae8 = 0;
        local_2ae4 = 0;
        local_2ae0 = 0;
        local_2adc = 0;
        local_2ad8 = 0;
        local_2ad0 = 0;
        local_2b08 = 0;
        local_2ac8 = local_9c0;
        for (local_2b14 = 0; local_2b14 + 1 < local_20dc; local_2b14 = local_2b14 + 2) {
          local_2094 = local_2b14 / 2;
          local_2088 = &local_2b68;
          local_2090 = &local_2130;
          local_988 = (char *)((long)local_2130 + local_20f0 * local_2094 * local_2120);
          local_970 = &local_2b68;
          local_918 = (long)local_2104 * (long)local_2100 * local_2120;
          local_1b40 = &local_2b68;
          local_1df0 = &local_2b68;
          local_1d7c = local_2abc / 4 + local_2abc % 4;
          local_1d70 = &local_2bb8;
          local_bdc = *(int *)((long)local_20d0 + 0x2c);
          local_be0 = (int)local_20d0[6];
          local_be4 = *(undefined4 *)((long)local_20d0 + 0x34);
          local_bf0 = (char *)(*local_20d0 + local_20d0[8] * (long)local_1d7c * local_20d0[2]);
          local_bf8 = local_20d0[2];
          local_bfc = (undefined4)local_20d0[3];
          local_c08 = local_20d0[4];
          local_bd8 = &local_2bb8;
          local_868 = (long)local_bdc * (long)local_be0 * local_bf8;
          local_1bd8 = &local_2bb8;
          local_1de0 = &local_2bb8;
          local_2b30 = 0;
          local_2b34 = 0;
          local_2b38 = 0;
          local_2b3c = 0;
          local_2b48 = local_2110;
          local_2b50 = 0;
          local_2b58 = 0;
          local_2b60 = 0;
          local_2b68 = 0;
          local_86c = 0x10;
          local_91c = 0x10;
          local_974 = local_2104;
          local_978 = local_2100;
          local_97c = local_20fc;
          local_990 = local_2120;
          local_994 = local_2118;
          local_9a0 = local_2110;
          local_1d7d = 1;
          local_2095 = 1;
          local_2b28 = 0;
          local_2b40 = 0;
          local_2bb8 = 0;
          local_2ba8 = 0;
          local_2ba0 = 0;
          local_2b90 = 0;
          local_2b8c = 0;
          local_2b88 = 0;
          local_2b84 = 0;
          local_2b80 = 0;
          local_2b78 = 0;
          local_2bb0 = 0;
          local_2bbc = (local_20e4 / 4) * local_20e0;
          local_2bc0 = (local_20e4 % 4) * local_20e0;
          local_2bc4 = 0;
          local_2bc8 = 0;
          if (0 < local_2bbc) {
            local_1af8 = 0;
            uStack_1af0 = 0;
            local_2bd8 = 0;
            uStack_2bd0 = 0;
            local_1b08._8_8_ = SUB168(ZEXT816(0),4);
            local_2be8 = 0;
            uStack_2be0 = local_1b08._8_8_;
            local_2bec = 0;
            if (0 < local_2bbc) {
              halt_baddata();
            }
            local_f18 = 0;
            uStack_f10 = 0;
            local_eb8 = 0;
            uStack_eb0 = 0;
            local_ec8 = 0;
            uStack_ec0 = 0;
            local_f28 = vpunpckhqdq_avx(ZEXT816(0),ZEXT816(0));
            local_ed8 = local_f28._0_8_;
            uStack_ed0 = local_f28._8_8_;
            local_ee8 = 0;
            uStack_ee0 = 0;
            local_f38 = vpaddd_avx(local_f28,ZEXT816(0));
            local_f48 = vpshufd_avx(local_f38,0xb1);
            local_ef8 = local_f38._0_8_;
            uStack_ef0 = local_f38._8_8_;
            local_f08 = local_f48._0_8_;
            uStack_f00 = local_f48._8_8_;
            local_f58 = vpaddd_avx(local_f38,local_f48);
            local_58 = local_f58._0_8_;
            uStack_50 = local_f58._8_8_;
            local_68 = local_f58._0_8_;
            uVar26 = local_68;
            uStack_60 = local_f58._8_8_;
            local_68._0_4_ = local_f58._0_4_;
            local_2bc4 = (int)local_68;
            local_fc8 = 0;
            uStack_fc0 = local_1b08._8_8_;
            local_f68 = 0;
            uStack_f60 = local_1b08._8_8_;
            local_f78 = 0;
            uStack_f70 = local_1b08._8_8_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_1b08._8_8_;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_1b08._8_8_;
            local_fd8 = vpunpckhqdq_avx(auVar5 << 0x40,auVar6 << 0x40);
            local_f88 = local_fd8._0_8_;
            uStack_f80 = local_fd8._8_8_;
            local_f98 = 0;
            uStack_f90 = local_1b08._8_8_;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_1b08._8_8_;
            local_fe8 = vpaddd_avx(local_fd8,auVar7 << 0x40);
            local_ff8 = vpshufd_avx(local_fe8,0xb1);
            local_fa8 = local_fe8._0_8_;
            uStack_fa0 = local_fe8._8_8_;
            local_fb8 = local_ff8._0_8_;
            uStack_fb0 = local_ff8._8_8_;
            local_1008 = vpaddd_avx(local_fe8,local_ff8);
            local_38 = local_1008._0_8_;
            uStack_30 = local_1008._8_8_;
            local_48 = local_1008._0_8_;
            uVar27 = local_48;
            uStack_40 = local_1008._8_8_;
            local_48._0_4_ = local_1008._0_4_;
            local_2bc8 = (int)local_48;
            local_1b08 = ZEXT816(0) << 0x20;
            local_68 = uVar26;
            local_48 = uVar27;
          }
          local_2b70 = local_bf0;
          local_2b20 = local_988;
          for (local_2c6c = 0; local_2c6c < local_2bc0; local_2c6c = local_2c6c + 1) {
            local_2c6d = *local_2b20;
            local_2c6e = local_2b20[1];
            local_2c6f = *local_2b70;
            local_2bc4 = (int)local_2c6d * (int)local_2c6f + local_2bc4;
            local_2bc8 = (int)local_2c6e * (int)local_2c6f + local_2bc8;
            local_2b20 = local_2b20 + 2;
            local_2b70 = local_2b70 + 1;
          }
          *local_2ac8 = local_2bc4;
          local_2ac8[1] = local_2bc8;
          local_2ac8 = local_2ac8 + 2;
          local_648 = local_1de0;
          local_628 = local_1df0;
          local_2b98 = local_c08;
        }
        for (; local_2b14 < local_20dc; local_2b14 = local_2b14 + 1) {
          local_20ac = local_2b14 / 2 + local_2b14 % 2;
          local_20a0 = &local_2cc0;
          local_20a8 = &local_2130;
          local_950 = (ulong *)((long)local_2130 + local_20f0 * local_20ac * local_2120);
          local_938 = &local_2cc0;
          local_928 = (long)local_2104 * (long)local_2100 * local_2120;
          local_1b48 = &local_2cc0;
          local_1dd0 = &local_2cc0;
          local_1d9c = local_2abc / 4 + local_2abc % 4;
          local_1d90 = &local_2d10;
          local_ba4 = *(int *)((long)local_20d0 + 0x2c);
          local_ba8 = (int)local_20d0[6];
          local_bac = *(undefined4 *)((long)local_20d0 + 0x34);
          local_bb8 = (ulong *)(*local_20d0 + local_20d0[8] * (long)local_1d9c * local_20d0[2]);
          local_bc0 = local_20d0[2];
          local_bc4 = (undefined4)local_20d0[3];
          local_bd0 = local_20d0[4];
          local_ba0 = &local_2d10;
          local_878 = (long)local_ba4 * (long)local_ba8 * local_bc0;
          local_2c88 = 0;
          local_2c8c = 0;
          local_2c90 = 0;
          local_2c94 = 0;
          local_2ca0 = local_2110;
          local_2ca8 = 0;
          local_2cb0 = 0;
          local_2cb8 = 0;
          local_2cc0 = 0;
          local_87c = 0x10;
          local_92c = 0x10;
          local_93c = local_2104;
          local_940 = local_2100;
          local_944 = local_20fc;
          local_958 = local_2120;
          local_95c = local_2118;
          local_968 = local_2110;
          local_1d9d = 1;
          local_20ad = 1;
          local_2c80 = 0;
          local_2c98 = 0;
          local_1be0 = &local_2d10;
          local_1dc0 = &local_2d10;
          local_2d10 = 0;
          local_2d00 = 0;
          local_2cf8 = 0;
          local_2ce8 = 0;
          local_2ce4 = 0;
          local_2ce0 = 0;
          local_2cdc = 0;
          local_2cd8 = 0;
          local_2cd0 = 0;
          local_2d08 = 0;
          iVar28 = (local_20e4 / 4) * local_20e0;
          local_2d1c = 0;
          local_2cc8 = local_bb8;
          local_2c78 = local_950;
          if (0 < iVar28) {
            local_1b28 = 0;
            uStack_1b20 = 0;
            local_2d38 = 0;
            uStack_2d30 = 0;
            for (local_2d3c = 0; local_2d3c < iVar28; local_2d3c = local_2d3c + 1) {
              local_1a10 = local_2c78;
              local_1a28 = *local_2c78;
              uStack_1a20 = 0;
              uStack_1930 = 0;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = local_1a28;
              auVar5 = vpmovsxbw_avx(auVar8);
              local_3818 = auVar5._0_8_;
              uStack_1690 = auVar5._8_8_;
              local_1a30 = local_2cc8;
              local_1a48 = *local_2cc8;
              uStack_1a40 = 0;
              uStack_1940 = 0;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_1a48;
              auVar6 = vpmovsxbw_avx(auVar9);
              local_3838 = auVar6._0_8_;
              uStack_3830 = auVar6._8_8_;
              local_1698 = local_3818;
              local_16a8 = local_3838;
              uStack_16a0 = uStack_3830;
              auVar7 = vpmullw_avx(auVar5,auVar6);
              local_3848 = auVar7._0_8_;
              uStack_3840 = auVar7._8_8_;
              local_15d8 = local_3818;
              local_15e8 = local_3838;
              uStack_15e0 = uStack_3830;
              auVar5 = vpmulhw_avx(auVar5,auVar6);
              local_3858 = auVar5._0_8_;
              uStack_3850 = auVar5._8_8_;
              local_1378 = local_3848;
              uStack_1370 = uStack_3840;
              local_1388 = local_3858;
              uStack_1380 = uStack_3850;
              auVar5 = vpunpcklwd_avx(auVar7,auVar5);
              local_3868 = auVar5._0_8_;
              local_1528 = local_3868;
              uStack_3860 = auVar5._8_8_;
              uStack_1520 = uStack_3860;
              local_1518 = local_2d38;
              uStack_1510 = uStack_2d30;
              auVar10._8_8_ = uStack_2d30;
              auVar10._0_8_ = local_2d38;
              auVar5 = vpaddd_avx(auVar10,auVar5);
              local_2d38 = auVar5._0_8_;
              uStack_2d30 = auVar5._8_8_;
              local_2c78 = (ulong *)((long)local_2c78 + 4);
              local_2cc8 = (ulong *)((long)local_2cc8 + 4);
              local_1948 = local_1a48;
              local_1938 = local_1a28;
              uStack_15d0 = uStack_1690;
            }
            local_1078 = local_2d38;
            uStack_1070 = uStack_2d30;
            local_1018 = local_2d38;
            uStack_1010 = uStack_2d30;
            local_1028 = local_2d38;
            uStack_1020 = uStack_2d30;
            auVar16._8_8_ = uStack_2d30;
            auVar16._0_8_ = local_2d38;
            auVar15._8_8_ = uStack_2d30;
            auVar15._0_8_ = local_2d38;
            local_1088 = vpunpckhqdq_avx(auVar16,auVar15);
            local_1038 = local_1088._0_8_;
            uStack_1030 = local_1088._8_8_;
            local_1048 = local_2d38;
            uStack_1040 = uStack_2d30;
            auVar14._8_8_ = uStack_2d30;
            auVar14._0_8_ = local_2d38;
            local_1098 = vpaddd_avx(local_1088,auVar14);
            local_10a8 = vpshufd_avx(local_1098,0xb1);
            local_1058 = local_1098._0_8_;
            uStack_1050 = local_1098._8_8_;
            local_1068 = local_10a8._0_8_;
            uStack_1060 = local_10a8._8_8_;
            local_10b8 = vpaddd_avx(local_1098,local_10a8);
            local_18 = local_10b8._0_8_;
            uStack_10 = local_10b8._8_8_;
            local_28 = local_10b8._0_8_;
            uVar26 = local_28;
            uStack_20 = local_10b8._8_8_;
            local_28._0_4_ = local_10b8._0_4_;
            local_2d1c = (int)local_28;
            local_28 = uVar26;
          }
          for (local_2dac = 0; local_2dac < (local_20e4 % 4) * local_20e0;
              local_2dac = local_2dac + 1) {
            local_2d1c = (int)(char)*local_2c78 * (int)(char)*local_2cc8 + local_2d1c;
            local_2c78 = (ulong *)((long)local_2c78 + 1);
            local_2cc8 = (ulong *)((long)local_2cc8 + 1);
          }
          *local_2ac8 = local_2d1c;
          local_2ac8 = local_2ac8 + 1;
          local_688 = local_1dc0;
          local_668 = local_1dd0;
          local_2cf0 = local_bd0;
        }
        local_2abc = local_2abc + 1;
        local_608 = local_1e00;
        local_2af0 = local_9d8;
      } while( true );
    }
    local_254c = local_2548 * 4;
    local_1fe0 = &local_25a0;
    local_afc = *(int *)((long)local_20c8 + 0x2c);
    local_b00 = (int)local_20c8[6];
    local_b04 = *(undefined4 *)((long)local_20c8 + 0x34);
    local_b10 = (undefined4 *)(*local_20c8 + local_20c8[8] * (long)local_254c * local_20c8[2]);
    local_b18 = local_20c8[2];
    local_b1c = (undefined4)local_20c8[3];
    local_b28 = local_20c8[4];
    local_af8 = &local_25a0;
    local_8a8 = (long)local_afc * (long)local_b00 * local_b18;
    local_8ac = 0x10;
    local_1fed = 1;
    local_1b50 = &local_25a0;
    local_1e80 = &local_25a0;
    local_2004 = local_254c + 1;
    local_1ff8 = &local_25f0;
    local_ac4 = *(int *)((long)local_20c8 + 0x2c);
    local_ac8 = (int)local_20c8[6];
    local_acc = *(undefined4 *)((long)local_20c8 + 0x34);
    local_ad8 = (undefined4 *)(*local_20c8 + local_20c8[8] * (long)local_2004 * local_20c8[2]);
    local_ae0 = local_20c8[2];
    local_ae4 = (undefined4)local_20c8[3];
    local_af0 = local_20c8[4];
    local_ac0 = &local_25f0;
    local_8b8 = (long)local_ac4 * (long)local_ac8 * local_ae0;
    local_1b58 = &local_25f0;
    local_1e70 = &local_25f0;
    local_201c = local_254c + 2;
    local_2010 = &local_2640;
    local_a8c = *(int *)((long)local_20c8 + 0x2c);
    local_a90 = (int)local_20c8[6];
    local_a94 = *(undefined4 *)((long)local_20c8 + 0x34);
    local_aa0 = (undefined4 *)(*local_20c8 + local_20c8[8] * (long)local_201c * local_20c8[2]);
    local_aa8 = local_20c8[2];
    local_aac = (undefined4)local_20c8[3];
    local_ab8 = local_20c8[4];
    local_a88 = &local_2640;
    local_8c8 = (long)local_a8c * (long)local_a90 * local_aa8;
    local_1b60 = &local_2640;
    local_1e60 = &local_2640;
    local_2034 = local_254c + 3;
    local_2028 = &local_2690;
    local_a54 = *(int *)((long)local_20c8 + 0x2c);
    local_a58 = (int)local_20c8[6];
    local_a5c = *(undefined4 *)((long)local_20c8 + 0x34);
    local_a68 = (undefined4 *)(*local_20c8 + local_20c8[8] * (long)local_2034 * local_20c8[2]);
    local_a70 = local_20c8[2];
    local_a74 = (undefined4)local_20c8[3];
    local_a80 = local_20c8[4];
    local_a50 = &local_2690;
    local_8d8 = (long)local_a54 * (long)local_a58 * local_a70;
    local_1b68 = &local_2690;
    local_1e50 = &local_2690;
    local_2568 = 0;
    local_256c = 0;
    local_2570 = 0;
    local_2574 = 0;
    local_2588 = 0;
    local_2590 = 0;
    local_2598 = 0;
    local_25a0 = 0;
    local_25b8 = 0;
    local_25bc = 0;
    local_25c0 = 0;
    local_25c4 = 0;
    local_25d8 = 0;
    local_25e0 = 0;
    local_25e8 = 0;
    local_25f0 = 0;
    local_2608 = 0;
    local_260c = 0;
    local_2610 = 0;
    local_2614 = 0;
    local_2628 = 0;
    local_2630 = 0;
    local_2638 = 0;
    local_2640 = 0;
    local_8bc = 0x10;
    local_8cc = 0x10;
    local_8dc = 0x10;
    local_2005 = 1;
    local_201d = 1;
    local_2035 = 1;
    local_2560 = 0;
    local_2578 = 0;
    local_25b0 = 0;
    local_25c8 = 0;
    local_2600 = 0;
    local_2618 = 0;
    local_2690 = 0;
    local_2680 = 0;
    local_2678 = 0;
    local_2668 = 0;
    local_2664 = 0;
    local_2660 = 0;
    local_265c = 0;
    local_2658 = 0;
    local_2650 = 0;
    local_2688 = 0;
    local_2648 = local_a68;
    local_25f8 = local_aa0;
    local_25a8 = local_ad8;
    local_2558 = local_b10;
    for (local_2694 = 0; local_2694 + 1 < local_20dc; local_2694 = local_2694 + 2) {
      local_204c = local_2694 / 2;
      local_2040 = &local_26e8;
      local_2048 = &local_2130;
      local_a30 = (ulong *)((long)local_2130 + local_20f0 * local_204c * local_2120);
      local_a18 = &local_26e8;
      local_8e8 = (long)local_2104 * (long)local_2100 * local_2120;
      local_1b30 = &local_26e8;
      local_1e40 = &local_26e8;
      local_1d3c = local_254c / 4;
      local_1d30 = &local_2738;
      local_c4c = *(int *)((long)local_20d0 + 0x2c);
      local_c50 = (int)local_20d0[6];
      local_c54 = *(undefined4 *)((long)local_20d0 + 0x34);
      local_c60 = (ulong *)(*local_20d0 + local_20d0[8] * (long)local_1d3c * local_20d0[2]);
      local_c68 = local_20d0[2];
      local_c6c = (undefined4)local_20d0[3];
      local_c78 = local_20d0[4];
      local_c48 = &local_2738;
      local_848 = (long)local_c4c * (long)local_c50 * local_c68;
      local_1bc8 = &local_2738;
      local_1e30 = &local_2738;
      local_26b0 = 0;
      local_26b4 = 0;
      local_26b8 = 0;
      local_26bc = 0;
      local_26c8 = local_2110;
      local_26d0 = 0;
      local_26d8 = 0;
      local_26e0 = 0;
      local_26e8 = 0;
      local_84c = 0x10;
      local_8ec = 0x10;
      local_a1c = local_2104;
      local_a20 = local_2100;
      local_a24 = local_20fc;
      local_a38 = local_2120;
      local_a3c = local_2118;
      local_a48 = local_2110;
      local_1d3d = 1;
      local_204d = 1;
      local_26a8 = 0;
      local_26c0 = 0;
      local_2738 = 0;
      local_2728 = 0;
      local_2720 = 0;
      local_2710 = 0;
      local_270c = 0;
      local_2708 = 0;
      local_2704 = 0;
      local_2700 = 0;
      local_26f8 = 0;
      local_2730 = 0;
      iVar28 = local_20e4;
      if (local_20e4 < 0) {
        iVar28 = local_20e4 + 3;
      }
      local_273c = (iVar28 >> 2) * local_20e0;
      local_2740 = (local_20e4 % 4) * local_20e0;
      local_1a58 = 0;
      uStack_1a50 = 0;
      local_2758 = 0;
      uStack_2750 = 0;
      local_1a68._8_8_ = SUB168(ZEXT816(0),4);
      local_2768 = 0;
      uStack_2760 = local_1a68._8_8_;
      if (0 < local_273c) {
        local_1a78._8_8_ = SUB168(ZEXT816(0),4);
        local_2778 = 0;
        uStack_2770 = local_1a78._8_8_;
        local_1a88._8_8_ = SUB168(ZEXT816(0),4);
        local_2788 = 0;
        uStack_2780 = local_1a88._8_8_;
        local_278c = 0;
        if (0 < local_273c) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *local_a30;
          auVar5 = vpmovsxbw_avx(auVar1);
          vpshufd_avx(auVar5,0x44);
          vpshufd_avx(auVar5,0xee);
          halt_baddata();
        }
        local_16d8 = 0;
        uStack_16d0 = 0;
        local_16e8 = 0;
        uStack_16e0 = local_1a78._8_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_1a78._8_8_;
        auVar5 = vphaddd_avx(ZEXT816(0),auVar17 << 0x40);
        local_31e8 = auVar5._0_8_;
        uStack_31e0 = auVar5._8_8_;
        local_2758 = local_31e8;
        uStack_2750 = uStack_31e0;
        local_16f8 = 0;
        uStack_16f0 = local_1a68._8_8_;
        local_1708 = 0;
        uStack_1700 = local_1a88._8_8_;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_1a68._8_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_1a88._8_8_;
        auVar5 = vphaddd_avx(auVar18 << 0x40,auVar19 << 0x40);
        local_31f8 = auVar5._0_8_;
        uStack_31f0 = auVar5._8_8_;
        local_2768 = local_31f8;
        uStack_2760 = uStack_31f0;
        local_1a88 = ZEXT816(0) << 0x20;
        local_1a78 = ZEXT816(0) << 0x20;
      }
      local_26f0 = local_c60;
      local_26a0 = local_a30;
      for (local_280c = 0; local_280c < local_2740; local_280c = local_280c + 1) {
        local_16ac = (ushort)*(char *)((long)local_26a0 + 1);
        local_16b0 = (ushort)*(char *)((long)local_26a0 + 1);
        local_16b4 = (ushort)(char)*local_26a0;
        local_16b8 = (ushort)(char)*local_26a0;
        auVar5 = vpinsrw_avx(ZEXT216(local_16b8),(uint)local_16b8,1);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_16b4,2);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_16b4,3);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_16b0,4);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_16b0,5);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_16ac,6);
        local_16c8 = vpinsrw_avx(auVar5,(uint)local_16ac,7);
        local_2828 = local_16c8._0_8_;
        uStack_2820 = local_16c8._8_8_;
        local_1970 = local_26f0;
        local_1988 = *local_26f0;
        uStack_1980 = 0;
        uStack_18f0 = 0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_1988;
        auVar5 = vpmovsxbw_avx(auVar2);
        local_2838 = vpshufd_avx(auVar5,0x44);
        local_15f8 = local_16c8._0_8_;
        uStack_15f0 = local_16c8._8_8_;
        local_1608 = local_2838._0_8_;
        uStack_1600 = local_2838._8_8_;
        auVar7 = vpmullw_avx(local_16c8,local_2838);
        local_3238 = auVar7._0_8_;
        local_2848 = local_3238;
        uStack_3230 = auVar7._8_8_;
        uStack_2840 = uStack_3230;
        local_1538 = local_16c8._0_8_;
        uStack_1530 = local_16c8._8_8_;
        local_1548 = local_2838._0_8_;
        uStack_1540 = local_2838._8_8_;
        auVar6 = vpmulhw_avx(local_16c8,local_2838);
        local_3248 = auVar6._0_8_;
        local_2858 = local_3248;
        uStack_3240 = auVar6._8_8_;
        uStack_2850 = uStack_3240;
        local_12d8 = local_3238;
        uStack_12d0 = uStack_3230;
        local_12e8 = local_3248;
        uStack_12e0 = uStack_3240;
        auVar5 = vpunpcklwd_avx(auVar7,auVar6);
        local_3258 = auVar5._0_8_;
        local_13a8 = local_3258;
        uStack_3250 = auVar5._8_8_;
        uStack_13a0 = uStack_3250;
        local_1398 = local_2758;
        uStack_1390 = uStack_2750;
        auVar13._8_8_ = uStack_2750;
        auVar13._0_8_ = local_2758;
        auVar5 = vpaddd_avx(auVar13,auVar5);
        local_3278 = auVar5._0_8_;
        local_2758 = local_3278;
        uStack_3270 = auVar5._8_8_;
        uStack_2750 = uStack_3270;
        local_1258 = local_3238;
        uStack_1250 = uStack_3230;
        local_1268 = local_3248;
        uStack_1260 = uStack_3240;
        auVar5 = vpunpckhwd_avx(auVar7,auVar6);
        local_3288 = auVar5._0_8_;
        local_13c8 = local_3288;
        uStack_3280 = auVar5._8_8_;
        uStack_13c0 = uStack_3280;
        local_13b8 = local_2768;
        uStack_13b0 = uStack_2760;
        auVar12._8_8_ = uStack_2760;
        auVar12._0_8_ = local_2768;
        auVar5 = vpaddd_avx(auVar12,auVar5);
        local_32a8 = auVar5._0_8_;
        local_2768 = local_32a8;
        uStack_32a0 = auVar5._8_8_;
        uStack_2760 = uStack_32a0;
        local_26a0 = (ulong *)((long)local_26a0 + 2);
        local_26f0 = (ulong *)((long)local_26f0 + 4);
        local_18f8 = local_1988;
        local_16b6 = local_16b8;
        local_16b2 = local_16b4;
        local_16ae = local_16b0;
        local_16aa = local_16ac;
      }
      local_11f0 = &local_2878;
      local_1208 = local_2758;
      uStack_1200 = uStack_2750;
      uStack_2874 = (undefined4)((ulong)local_2758 >> 0x20);
      local_2878 = (undefined4)local_2758;
      uStack_286c = (undefined4)((ulong)uStack_2750 >> 0x20);
      uStack_2870 = (undefined4)uStack_2750;
      local_1210 = &local_2868;
      local_1228 = local_2768;
      uStack_1220 = uStack_2760;
      uStack_2864 = (undefined4)((ulong)local_2768 >> 0x20);
      local_2868 = (undefined4)local_2768;
      uStack_285c = (undefined4)(uStack_2760 >> 0x20);
      uStack_2860 = (undefined4)uStack_2760;
      *local_2558 = local_2878;
      *local_25a8 = uStack_2874;
      *local_25f8 = uStack_2870;
      *local_2648 = uStack_286c;
      local_2558[1] = local_2868;
      local_25a8[1] = uStack_2864;
      local_25f8[1] = uStack_2860;
      local_2648[1] = uStack_285c;
      local_2558 = local_2558 + 2;
      local_25a8 = local_25a8 + 2;
      local_25f8 = local_25f8 + 2;
      local_2648 = local_2648 + 2;
      local_1a68 = ZEXT816(0) << 0x20;
      local_5a8 = local_1e30;
      local_588 = local_1e40;
      local_2718 = local_c78;
    }
    for (; local_2694 < local_20dc; local_2694 = local_2694 + 1) {
      local_2064 = local_2694 / 2 + local_2694 % 2;
      local_2058 = &local_28c8;
      local_2060 = &local_2130;
      local_9f8 = (ulong *)((long)local_2130 + local_20f0 * local_2064 * local_2120);
      local_9e0 = &local_28c8;
      local_8f8 = (long)local_2104 * (long)local_2100 * local_2120;
      local_1b38 = &local_28c8;
      local_1e20 = &local_28c8;
      local_28a8 = local_2110;
      local_8fc = 0x10;
      local_9e4 = local_2104;
      local_9e8 = local_2100;
      local_9ec = local_20fc;
      local_a00 = local_2120;
      local_a04 = local_2118;
      local_a10 = local_2110;
      local_2065 = 1;
      local_28c8 = 0;
      local_28b8 = 0;
      local_28b0 = 0;
      local_289c = 0;
      local_2898 = 0;
      local_2894 = 0;
      local_2890 = 0;
      local_28c0 = 0;
      local_1d5c = local_254c / 4;
      local_1d50 = &local_2918;
      local_c14 = *(int *)((long)local_20d0 + 0x2c);
      local_c18 = (int)local_20d0[6];
      local_c1c = *(undefined4 *)((long)local_20d0 + 0x34);
      local_c28 = (ulong *)(*local_20d0 + local_20d0[8] * (long)local_1d5c * local_20d0[2]);
      local_c30 = local_20d0[2];
      local_c34 = (undefined4)local_20d0[3];
      local_c40 = local_20d0[4];
      local_c10 = &local_2918;
      local_858 = (long)local_c14 * (long)local_c18 * local_c30;
      local_85c = 0x10;
      local_1d5d = 1;
      local_2888 = 0;
      local_28a0 = 0;
      local_1bd0 = &local_2918;
      local_1e10 = &local_2918;
      local_2918 = 0;
      local_2908 = 0;
      local_2900 = 0;
      local_28f0 = 0;
      local_28ec = 0;
      local_28e8 = 0;
      local_28e4 = 0;
      local_28e0 = 0;
      local_28d8 = 0;
      local_2910 = 0;
      iVar28 = local_20e4;
      if (local_20e4 < 0) {
        iVar28 = local_20e4 + 3;
      }
      local_291c = (iVar28 >> 2) * local_20e0;
      local_2920 = (local_20e4 % 4) * local_20e0;
      local_1aa8 = 0;
      uStack_1aa0 = 0;
      local_2938 = 0;
      uStack_2930 = 0;
      if (0 < local_291c) {
        local_1ab8._8_8_ = SUB168(ZEXT816(0),4);
        local_1ac8._8_8_ = SUB168(ZEXT816(0),4);
        local_1ad8._8_8_ = SUB168(ZEXT816(0),4);
        local_296c = 0;
        if (0 < local_291c) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *local_9f8;
          auVar5 = vpmovsxbw_avx(auVar3);
          vpshufd_avx(auVar5,0x44);
          halt_baddata();
        }
        local_11b8 = 0;
        uStack_11b0 = 0;
        local_11c8 = 0;
        uStack_11c0 = local_1ab8._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_1ab8._8_8_;
        auVar7 = vpunpckldq_avx(ZEXT816(0),auVar20 << 0x40);
        local_34c8 = auVar7._0_8_;
        uStack_34c0 = auVar7._8_8_;
        local_2a28 = local_34c8;
        uStack_2a20 = uStack_34c0;
        local_11d8 = 0;
        uStack_11d0 = local_1ac8._8_8_;
        local_11e8 = 0;
        uStack_11e0 = local_1ad8._8_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_1ac8._8_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_1ad8._8_8_;
        auVar8 = vpunpckldq_avx(auVar21 << 0x40,auVar22 << 0x40);
        local_34d8 = auVar8._0_8_;
        uStack_34d0 = auVar8._8_8_;
        local_2a38 = local_34d8;
        uStack_2a30 = uStack_34d0;
        local_1178 = 0;
        uStack_1170 = 0;
        local_1188 = 0;
        uStack_1180 = local_1ab8._8_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_1ab8._8_8_;
        auVar5 = vpunpckhdq_avx(ZEXT816(0),auVar23 << 0x40);
        local_34e8 = auVar5._0_8_;
        uStack_34e0 = auVar5._8_8_;
        local_2a48 = local_34e8;
        uStack_2a40 = uStack_34e0;
        local_1198 = 0;
        uStack_1190 = local_1ac8._8_8_;
        local_11a8 = 0;
        uStack_11a0 = local_1ad8._8_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_1ac8._8_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_1ad8._8_8_;
        auVar6 = vpunpckhdq_avx(auVar24 << 0x40,auVar25 << 0x40);
        local_34f8 = auVar6._0_8_;
        uStack_34f0 = auVar6._8_8_;
        local_2a58 = local_34f8;
        uStack_2a50 = uStack_34f0;
        local_1138 = local_34c8;
        uStack_1130 = uStack_34c0;
        local_1148 = local_34d8;
        uStack_1140 = uStack_34d0;
        auVar9 = vpunpcklqdq_avx(auVar7,auVar8);
        local_3508 = auVar9._0_8_;
        uStack_3500 = auVar9._8_8_;
        local_10f8 = local_34c8;
        uStack_10f0 = uStack_34c0;
        local_1108 = local_34d8;
        uStack_1100 = uStack_34d0;
        auVar7 = vpunpckhqdq_avx(auVar7,auVar8);
        local_3518 = auVar7._0_8_;
        uStack_3510 = auVar7._8_8_;
        local_2948 = local_3518;
        uStack_2940 = uStack_3510;
        local_1158 = local_34e8;
        uStack_1150 = uStack_34e0;
        local_1168 = local_34f8;
        uStack_1160 = uStack_34f0;
        auVar8 = vpunpcklqdq_avx(auVar5,auVar6);
        local_3528 = auVar8._0_8_;
        uStack_3520 = auVar8._8_8_;
        local_1118 = local_34e8;
        uStack_1110 = uStack_34e0;
        local_1128 = local_34f8;
        uStack_1120 = uStack_34f0;
        auVar6 = vpunpckhqdq_avx(auVar5,auVar6);
        local_3538 = auVar6._0_8_;
        uStack_3530 = auVar6._8_8_;
        local_2968 = local_3538;
        uStack_2960 = uStack_3530;
        local_1458 = local_3508;
        uStack_1450 = uStack_3500;
        local_1468 = local_3518;
        uStack_1460 = uStack_3510;
        auVar5 = vpaddd_avx(auVar9,auVar7);
        local_3548 = auVar5._0_8_;
        uStack_3540 = auVar5._8_8_;
        local_1478 = local_3528;
        uStack_1470 = uStack_3520;
        local_1488 = local_3538;
        uStack_1480 = uStack_3530;
        auVar6 = vpaddd_avx(auVar8,auVar6);
        local_3558 = auVar6._0_8_;
        uStack_3550 = auVar6._8_8_;
        local_2958 = local_3558;
        uStack_2950 = uStack_3550;
        local_1498 = local_3548;
        uStack_1490 = uStack_3540;
        local_14a8 = local_3558;
        uStack_14a0 = uStack_3550;
        auVar5 = vpaddd_avx(auVar5,auVar6);
        local_3568 = auVar5._0_8_;
        uStack_3560 = auVar5._8_8_;
        local_2938 = local_3568;
        uStack_2930 = uStack_3560;
        local_1ad8 = ZEXT816(0) << 0x20;
        local_1ac8 = ZEXT816(0) << 0x20;
        local_1ab8 = ZEXT816(0) << 0x20;
      }
      local_28d0 = local_c28;
      local_2880 = local_9f8;
      for (local_2a5c = 0; local_2a5c < local_2920; local_2a5c = local_2a5c + 1) {
        local_10da = (ushort)(char)*local_2880;
        auVar5 = vpinsrw_avx(ZEXT216(local_10da),(uint)local_10da,1);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_10da,2);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_10da,3);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_10da,4);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_10da,5);
        auVar5 = vpinsrw_avx(auVar5,(uint)local_10da,6);
        local_10d8 = vpinsrw_avx(auVar5,(uint)local_10da,7);
        local_2a78 = local_10d8._0_8_;
        uStack_2a70 = local_10d8._8_8_;
        local_19b0 = local_28d0;
        local_19c8 = *local_28d0;
        uStack_19c0 = 0;
        uStack_1910 = 0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_19c8;
        auVar5 = vpmovsxbw_avx(auVar4);
        local_35a8 = auVar5._0_8_;
        local_2a88 = local_35a8;
        uStack_35a0 = auVar5._8_8_;
        uStack_2a80 = uStack_35a0;
        local_1658 = local_10d8._0_8_;
        uStack_1650 = local_10d8._8_8_;
        local_1668 = local_35a8;
        uStack_1660 = uStack_35a0;
        auVar6 = vpmullw_avx(local_10d8,auVar5);
        local_35b8 = auVar6._0_8_;
        local_2a98 = local_35b8;
        uStack_35b0 = auVar6._8_8_;
        uStack_2a90 = uStack_35b0;
        local_1598 = local_10d8._0_8_;
        uStack_1590 = local_10d8._8_8_;
        local_15a8 = local_35a8;
        uStack_15a0 = uStack_35a0;
        auVar5 = vpmulhw_avx(local_10d8,auVar5);
        local_35c8 = auVar5._0_8_;
        local_2aa8 = local_35c8;
        uStack_35c0 = auVar5._8_8_;
        uStack_2aa0 = uStack_35c0;
        local_1338 = local_35b8;
        uStack_1330 = uStack_35b0;
        local_1348 = local_35c8;
        uStack_1340 = uStack_35c0;
        auVar5 = vpunpcklwd_avx(auVar6,auVar5);
        local_35d8 = auVar5._0_8_;
        local_14c8 = local_35d8;
        uStack_35d0 = auVar5._8_8_;
        uStack_14c0 = uStack_35d0;
        local_14b8 = local_2938;
        uStack_14b0 = uStack_2930;
        auVar11._8_8_ = uStack_2930;
        auVar11._0_8_ = local_2938;
        auVar5 = vpaddd_avx(auVar11,auVar5);
        local_35f8 = auVar5._0_8_;
        local_2938 = local_35f8;
        uStack_35f0 = auVar5._8_8_;
        uStack_2930 = uStack_35f0;
        local_2880 = (ulong *)((long)local_2880 + 1);
        local_28d0 = (ulong *)((long)local_28d0 + 4);
        local_1918 = local_19c8;
        local_10c8 = local_10da;
        local_10c6 = local_10da;
        local_10c4 = local_10da;
        local_10c2 = local_10da;
        local_10c0 = local_10da;
        local_10be = local_10da;
        local_10bc = local_10da;
        local_10ba = local_10da;
      }
      local_1230 = &local_2ab8;
      local_1248 = local_2938;
      uStack_1240 = uStack_2930;
      uStack_2ab4 = (undefined4)((ulong)local_2938 >> 0x20);
      local_2ab8 = (undefined4)local_2938;
      uStack_2aac = (undefined4)((ulong)uStack_2930 >> 0x20);
      uStack_2ab0 = (undefined4)uStack_2930;
      *local_2558 = local_2ab8;
      *local_25a8 = uStack_2ab4;
      *local_25f8 = uStack_2ab0;
      *local_2648 = uStack_2aac;
      local_2558 = local_2558 + 1;
      local_25a8 = local_25a8 + 1;
      local_25f8 = local_25f8 + 1;
      local_2648 = local_2648 + 1;
      local_5e8 = local_1e10;
      local_5c8 = local_1e20;
      local_28f8 = local_c40;
    }
    local_2548 = local_2548 + 1;
    local_1fec = local_254c;
    local_568 = local_1e50;
    local_548 = local_1e60;
    local_528 = local_1e70;
    local_508 = local_1e80;
    local_2670 = local_a80;
    local_2620 = local_ab8;
    local_25d0 = local_af0;
    local_2580 = local_b28;
  } while( true );
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}